

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegistryAccess.cpp
# Opt level: O1

void bhf::ads::VerifyDataLen(uint32_t type,size_t dataLen,size_t lineNumber)

{
  ostream *poVar1;
  runtime_error *prVar2;
  stringstream ss;
  char local_1e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  switch(type) {
  case 0:
    if (dataLen == 0) {
      std::__cxx11::stringstream::stringstream(local_1a0);
      if (lineNumber == 0xffffffffffffffff) {
        std::__ostream_insert<char,std::char_traits<char>>(local_190,"Invalid network data: ",0x16);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_190,"data is non-empty but type is REG_N0NE",0x26);
        local_1e0._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(local_190,(char *)&local_1e0,1);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(local_190,"Invalid file format: ",0x15);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_190,"data is non-empty but type is REG_N0NE",0x26);
        std::__ostream_insert<char,std::char_traits<char>>(local_190," in line ",9);
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_190);
        local_1e0._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_1e0,1);
      }
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar2,(string *)&local_1e0);
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    break;
  case 1:
  case 2:
  case 3:
  case 7:
    break;
  case 4:
    if (dataLen != 4) {
      std::__cxx11::stringstream::stringstream(local_1a0);
      if (lineNumber == 0xffffffffffffffff) {
        std::__ostream_insert<char,std::char_traits<char>>(local_190,"Invalid network data: ",0x16);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_190,"not enough data bytes for REG_DWORD",0x23);
        local_1e0._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(local_190,(char *)&local_1e0,1);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(local_190,"Invalid file format: ",0x15);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_190,"not enough data bytes for REG_DWORD",0x23);
        std::__ostream_insert<char,std::char_traits<char>>(local_190," in line ",9);
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_190);
        local_1e0._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_1e0,1);
      }
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar2,(string *)&local_1e0);
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    break;
  default:
    std::__cxx11::stringstream::stringstream(local_1a0);
    if (lineNumber == 0xffffffffffffffff) {
      std::__ostream_insert<char,std::char_traits<char>>(local_190,"Invalid network data: ",0x16);
      std::__cxx11::to_string(&local_1c0,type);
      std::operator+(&local_1e0,"unsupported type ",&local_1c0);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_190,
                          (char *)CONCAT71(local_1e0._M_dataplus._M_p._1_7_,
                                           local_1e0._M_dataplus._M_p._0_1_),
                          local_1e0._M_string_length);
      local_1e1 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_1e1,1);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(local_190,"Invalid file format: ",0x15);
      std::__cxx11::to_string(&local_1c0,type);
      std::operator+(&local_1e0,"unsupported type ",&local_1c0);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_190,
                          (char *)CONCAT71(local_1e0._M_dataplus._M_p._1_7_,
                                           local_1e0._M_dataplus._M_p._0_1_),
                          local_1e0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," in line ",9);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      local_1e1 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_1e1,1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_1e0._M_dataplus._M_p._1_7_,local_1e0._M_dataplus._M_p._0_1_) !=
        &local_1e0.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_1e0._M_dataplus._M_p._1_7_,local_1e0._M_dataplus._M_p._0_1_));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p);
    }
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar2,(string *)&local_1e0);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case 0xb:
    if (dataLen != 8) {
      std::__cxx11::stringstream::stringstream(local_1a0);
      if (lineNumber == 0xffffffffffffffff) {
        std::__ostream_insert<char,std::char_traits<char>>(local_190,"Invalid network data: ",0x16);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_190,"not enough data bytes for REG_QWORD",0x23);
        local_1e0._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(local_190,(char *)&local_1e0,1);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(local_190,"Invalid file format: ",0x15);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_190,"not enough data bytes for REG_QWORD",0x23);
        std::__ostream_insert<char,std::char_traits<char>>(local_190," in line ",9);
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_190);
        local_1e0._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_1e0,1);
      }
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar2,(string *)&local_1e0);
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

static void VerifyDataLen(const uint32_t type, const size_t dataLen, const size_t lineNumber)
{
    switch (type) {
    case REG_NONE:
        if (!dataLen) {
            PARSING_EXCEPTION("data is non-empty but type is REG_N0NE");
        }
        break;

    case REG_SZ:
    case REG_EXPAND_SZ:
    case REG_BINARY:
    case REG_MULTI_SZ:
        break;

    case REG_DWORD:
        if (sizeof(uint32_t) != dataLen) {
            PARSING_EXCEPTION("not enough data bytes for REG_DWORD");
        }
        break;

    case REG_QWORD:
        if (sizeof(uint64_t) != dataLen) {
            PARSING_EXCEPTION("not enough data bytes for REG_QWORD");
        }
        break;

    default:
        PARSING_EXCEPTION("unsupported type " + std::to_string(type));
    }
}